

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerSweep.cpp
# Opt level: O2

void __thiscall
Memory::RecyclerSweep::
MergePendingNewHeapBlockList<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>>
          (RecyclerSweep *this)

{
  SmallLeafHeapBlockT<SmallAllocationBlockAttributes> *list;
  
  list = (this->leafData).pendingMergeNewHeapBlockList;
  (this->leafData).pendingMergeNewHeapBlockList =
       (SmallLeafHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
  HeapBlockList::
  ForEachEditing<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>,Memory::RecyclerSweep::MergePendingNewHeapBlockList<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>>()::_lambda(Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>*)_1_>
            (list,(anon_class_8_1_8991fb9c)this);
  return;
}

Assistant:

void
RecyclerSweep::MergePendingNewHeapBlockList()
{
    TBlockType *& blockList = this->GetData<TBlockType>().pendingMergeNewHeapBlockList;
    TBlockType * list = blockList;
    blockList = nullptr;
    HeapBlockList::ForEachEditing(list, [this](TBlockType * heapBlock)
    {
        auto& bucket = this->heapInfo->GetBucket<TBlockType::RequiredAttributes>(heapBlock->GetObjectSize());
        bucket.MergeNewHeapBlock(heapBlock);
    });
}